

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# testDeepTiledBasic.cpp
# Opt level: O3

void anon_unknown.dwarf_137552::generateRandomFile
               (int channelCount,Compression compression,bool bulkWrite,bool relativeCoords,
               string *filename)

{
  PixelType PVar1;
  bool bVar2;
  undefined1 auVar3 [16];
  char cVar4;
  ushort uVar5;
  Array2D<void_*> *pAVar6;
  int iVar7;
  int iVar8;
  int iVar9;
  int iVar10;
  float fVar11;
  int iVar12;
  int iVar13;
  ostream *poVar14;
  string *psVar15;
  void *pvVar16;
  void *pvVar17;
  ulong uVar18;
  ulong *puVar19;
  void *pvVar20;
  int *piVar21;
  ushort uVar22;
  char *pcVar23;
  uint uVar24;
  int i;
  long lVar25;
  int iVar26;
  PixelType PVar27;
  long lVar28;
  uint uVar29;
  ulong size;
  char *pcVar30;
  ulong uVar31;
  ulong *puVar32;
  int iVar33;
  int j_2;
  ulong uVar34;
  long lVar35;
  long lVar36;
  ushort uVar37;
  long lVar38;
  long lVar39;
  float fVar40;
  int j;
  long local_2f0;
  long local_2e8;
  DeepTiledOutputFile file;
  Array<Imf_3_2::Array2D<void_*>_> data;
  Box2i box;
  int type;
  undefined4 uStack_23c;
  long local_230 [2];
  DeepFrameBuffer frameBuffer;
  stringstream ss;
  undefined1 local_1a8 [112];
  ios_base local_138 [264];
  
  if (bulkWrite && relativeCoords) {
    __assert_fail("bulkWrite == false",
                  "/workspace/llm4binary/github/license_all_cmakelists_1510/meshula[P]openexr/src/test/OpenEXRTest/testDeepTiledBasic.cpp"
                  ,0x3c,
                  "void (anonymous namespace)::generateRandomFile(int, Compression, bool, bool, const std::string &)"
                 );
  }
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"generating ",0xb);
  std::ostream::flush();
  frameBuffer._map._M_t._M_impl._0_8_ = 0;
  Imf_3_2::Header::Header
            ((Header *)&ss,(Box *)(anonymous_namespace)::displayWindow,
             (Box *)&(anonymous_namespace)::dataWindow,1.0,(Vec2 *)&frameBuffer,1.0,INCREASING_Y,
             compression);
  Imf_3_2::Header::operator=((Header *)(anonymous_namespace)::header,(Header *)&ss);
  Imf_3_2::Header::~Header((Header *)&ss);
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"compression ",0xc);
  poVar14 = (ostream *)std::ostream::operator<<(&std::cout,compression);
  std::__ostream_insert<char,std::char_traits<char>>(poVar14," ",1);
  std::ostream::flush();
  if (DAT_001f05d8._M_current != (anonymous_namespace)::channelTypes) {
    DAT_001f05d8._M_current = (anonymous_namespace)::channelTypes;
  }
  if (0 < channelCount) {
    iVar26 = 0;
    do {
      type = random_int(3);
      std::__cxx11::stringstream::stringstream((stringstream *)&ss);
      std::ostream::operator<<(local_1a8,iVar26);
      std::__cxx11::stringbuf::str();
      if (type == 0) {
        psVar15 = (string *)Imf_3_2::Header::channels();
        Imf_3_2::Channel::Channel((Channel *)&box,UINT,1,1,false);
        Imf_3_2::ChannelList::insert(psVar15,(Channel *)&frameBuffer);
      }
      if (type == 1) {
        psVar15 = (string *)Imf_3_2::Header::channels();
        Imf_3_2::Channel::Channel((Channel *)&box,HALF,1,1,false);
        Imf_3_2::ChannelList::insert(psVar15,(Channel *)&frameBuffer);
      }
      if (type == 2) {
        psVar15 = (string *)Imf_3_2::Header::channels();
        Imf_3_2::Channel::Channel((Channel *)&box,FLOAT,1,1,false);
        Imf_3_2::ChannelList::insert(psVar15,(Channel *)&frameBuffer);
      }
      if (DAT_001f05d8._M_current == DAT_001f05e0) {
        std::vector<int,std::allocator<int>>::_M_realloc_insert<int_const&>
                  ((vector<int,std::allocator<int>> *)&(anonymous_namespace)::channelTypes,
                   DAT_001f05d8,&type);
      }
      else {
        *DAT_001f05d8._M_current = type;
        DAT_001f05d8._M_current = DAT_001f05d8._M_current + 1;
      }
      if ((_Base_ptr *)frameBuffer._map._M_t._M_impl._0_8_ !=
          &frameBuffer._map._M_t._M_impl.super__Rb_tree_header._M_header._M_parent) {
        operator_delete((void *)frameBuffer._map._M_t._M_impl._0_8_,
                        (ulong)((long)&(frameBuffer._map._M_t._M_impl.super__Rb_tree_header.
                                        _M_header._M_parent)->_M_color + 1));
      }
      std::__cxx11::stringstream::~stringstream((stringstream *)&ss);
      std::ios_base::~ios_base(local_138);
      iVar26 = iVar26 + 1;
    } while (channelCount != iVar26);
  }
  Imf_3_2::Header::setType((string *)(anonymous_namespace)::header);
  iVar26 = random_int(0x111);
  iVar7 = random_int(0xa9);
  iVar7 = iVar7 + 1;
  _ss = iVar26 + 1;
  Imf_3_2::Header::setTileDescription((TileDescription *)(anonymous_namespace)::header);
  remove((filename->_M_dataplus)._M_p);
  Imf_3_2::DeepTiledOutputFile::DeepTiledOutputFile
            (&file,(filename->_M_dataplus)._M_p,(Header *)(anonymous_namespace)::header,8);
  frameBuffer._map._M_t._M_impl.super__Rb_tree_header._M_header._M_left =
       &frameBuffer._map._M_t._M_impl.super__Rb_tree_header._M_header;
  frameBuffer._map._M_t._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
  frameBuffer._map._M_t._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
  frameBuffer._map._M_t._M_impl.super__Rb_tree_header._M_node_count = 0;
  frameBuffer._map._M_t._M_impl.super__Rb_tree_header._M_header._M_right =
       frameBuffer._map._M_t._M_impl.super__Rb_tree_header._M_header._M_left;
  Imf_3_2::Slice::Slice(&frameBuffer._sampleCounts,HALF,(char *)0x0,0,0,1,1,0.0,false,false);
  size = (ulong)(uint)channelCount;
  Imf_3_2::Array<Imf_3_2::Array2D<void_*>_>::Array(&data,size);
  if (0 < channelCount) {
    lVar38 = 0;
    do {
      pAVar6 = data._data;
      pvVar16 = operator_new__(0x5a1c8);
      pvVar17 = *(void **)((long)&pAVar6->_data + lVar38);
      if (pvVar17 != (void *)0x0) {
        operator_delete__(pvVar17);
      }
      *(undefined8 *)((long)&pAVar6->_sizeX + lVar38) = 0xa9;
      *(undefined8 *)((long)&pAVar6->_sizeY + lVar38) = 0x111;
      *(void **)((long)&pAVar6->_data + lVar38) = pvVar16;
      lVar38 = lVar38 + 0x18;
    } while (size * 0x18 != lVar38);
  }
  pvVar17 = operator_new__(0x2d0e4);
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout," tileSizeX ",0xb);
  Imf_3_2::DeepTiledOutputFile::tileXSize();
  poVar14 = std::ostream::_M_insert<unsigned_long>((ulong)&std::cout);
  std::__ostream_insert<char,std::char_traits<char>>(poVar14," tileSizeY ",0xb);
  Imf_3_2::DeepTiledOutputFile::tileYSize();
  poVar14 = std::ostream::_M_insert<unsigned_long>((ulong)poVar14);
  std::__ostream_insert<char,std::char_traits<char>>(poVar14," ",1);
  iVar26 = Imf_3_2::DeepTiledOutputFile::numYLevels();
  iVar8 = Imf_3_2::DeepTiledOutputFile::numXLevels();
  lVar38 = (long)iVar26;
  lVar28 = (long)iVar8;
  uVar34 = lVar28 * lVar38;
  auVar3._8_8_ = 0;
  auVar3._0_8_ = uVar34;
  uVar18 = SUB168(auVar3 * ZEXT816(0x18),0);
  uVar31 = uVar18 + 8;
  if (0xfffffffffffffff7 < uVar18) {
    uVar31 = 0xffffffffffffffff;
  }
  if (SUB168(auVar3 * ZEXT816(0x18),8) != 0) {
    uVar31 = 0xffffffffffffffff;
  }
  puVar19 = (ulong *)operator_new__(uVar31);
  *puVar19 = uVar34;
  puVar19 = puVar19 + 1;
  if (uVar34 != 0) {
    memset(puVar19,0,((uVar18 - 0x18) / 0x18) * 0x18 + 0x18);
  }
  if (DAT_001f05f8 != (ulong *)0x0) {
    lVar36 = *(long *)((long)DAT_001f05f8 + -8);
    pvVar16 = (void *)((long)DAT_001f05f8 + -8);
    if (lVar36 != 0) {
      lVar35 = lVar36 * 0x18;
      do {
        pvVar20 = *(void **)((long)pvVar16 + lVar35);
        if (pvVar20 != (void *)0x0) {
          operator_delete__(pvVar20);
        }
        lVar35 = lVar35 + -0x18;
      } while (lVar35 != 0);
    }
    operator_delete__(pvVar16,lVar36 * 0x18 + 8);
  }
  (anonymous_namespace)::sampleCountWhole = lVar38;
  DAT_001f05f0 = lVar28;
  DAT_001f05f8 = puVar19;
  if (0 < iVar26) {
    local_2e8 = 0;
    lVar35 = 0;
    lVar36 = lVar28;
    do {
      if (0 < lVar36) {
        lVar39 = 0x10;
        lVar25 = 0;
        puVar32 = puVar19;
        do {
          pvVar20 = operator_new__(0x2d0e4);
          lVar36 = lVar36 * local_2e8;
          pvVar16 = *(void **)((long)puVar32 + lVar39 + lVar36);
          puVar19 = puVar32;
          if (pvVar16 != (void *)0x0) {
            operator_delete__(pvVar16);
            lVar28 = DAT_001f05f0;
            puVar19 = DAT_001f05f8;
          }
          *(undefined8 *)((long)puVar32 + lVar39 + lVar36 + -0x10) = 0xa9;
          *(undefined8 *)((long)puVar32 + lVar39 + -8 + lVar36) = 0x111;
          *(void **)((long)puVar32 + lVar39 + lVar36) = pvVar20;
          lVar25 = lVar25 + 1;
          lVar39 = lVar39 + 0x18;
          lVar38 = (anonymous_namespace)::sampleCountWhole;
          puVar32 = puVar19;
          lVar36 = lVar28;
        } while (lVar25 < lVar28);
      }
      lVar35 = lVar35 + 1;
      local_2e8 = local_2e8 + 0x18;
    } while (lVar35 < lVar38);
  }
  if (relativeCoords) {
    lVar38 = 0;
  }
  else {
    lVar38 = (long)DAT_001f05b4 * 0x111 + (long)(anonymous_namespace)::dataWindow;
  }
  Imf_3_2::Slice::Slice
            ((Slice *)&ss,UINT,(char *)((long)pvVar17 + lVar38 * -4),4,0x444,1,1,0.0,relativeCoords,
             relativeCoords);
  Imf_3_2::DeepFrameBuffer::insertSampleCountSlice((Slice *)&frameBuffer);
  if (0 < channelCount) {
    lVar28 = 0x10;
    uVar18 = 0;
    do {
      PVar1 = (anonymous_namespace)::channelTypes[uVar18];
      PVar27 = (uint)(PVar1 != UINT) * 3;
      if (PVar1 == HALF) {
        PVar27 = PVar1;
      }
      if (PVar1 == FLOAT) {
        PVar27 = PVar1;
      }
      std::__cxx11::stringstream::stringstream((stringstream *)&ss);
      std::ostream::operator<<(local_1a8,(int)uVar18);
      std::__cxx11::stringbuf::str();
      iVar26 = (anonymous_namespace)::channelTypes[uVar18];
      uVar31 = (ulong)(iVar26 == 0) << 2;
      if (iVar26 == 1) {
        uVar31 = 2;
      }
      if (iVar26 == 2) {
        uVar31 = 4;
      }
      Imf_3_2::DeepSlice::DeepSlice
                ((DeepSlice *)&box,PVar27,
                 (char *)(*(long *)((long)&(data._data)->_sizeX + lVar28) + lVar38 * -8),8,0x888,
                 uVar31,1,1,0.0,relativeCoords,relativeCoords);
      Imf_3_2::DeepFrameBuffer::insert((string *)&frameBuffer,(DeepSlice *)&type);
      if ((long *)CONCAT44(uStack_23c,type) != local_230) {
        operator_delete((long *)CONCAT44(uStack_23c,type),local_230[0] + 1);
      }
      std::__cxx11::stringstream::~stringstream((stringstream *)&ss);
      std::ios_base::~ios_base(local_138);
      uVar18 = uVar18 + 1;
      lVar28 = lVar28 + 0x18;
    } while (size != uVar18);
  }
  Imf_3_2::DeepTiledOutputFile::setFrameBuffer((DeepFrameBuffer *)&file);
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"writing ",8);
  std::ostream::flush();
  pcVar23 = "per-tile ";
  if (relativeCoords) {
    pcVar23 = "per-tile with relative coordinates ";
  }
  lVar38 = 9;
  if (relativeCoords) {
    lVar38 = 0x23;
  }
  pcVar30 = "bulk ";
  if (!bulkWrite) {
    pcVar30 = pcVar23;
  }
  lVar28 = 5;
  if (!bulkWrite) {
    lVar28 = lVar38;
  }
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,pcVar30,lVar28);
  std::ostream::flush();
  local_2f0 = 0;
  do {
    iVar26 = Imf_3_2::DeepTiledOutputFile::numYLevels();
    if (iVar26 <= local_2f0) {
      operator_delete__(pvVar17);
      Imf_3_2::Array<Imf_3_2::Array2D<void_*>_>::~Array(&data);
      std::
      _Rb_tree<Imf_3_2::Name,_std::pair<const_Imf_3_2::Name,_Imf_3_2::DeepSlice>,_std::_Select1st<std::pair<const_Imf_3_2::Name,_Imf_3_2::DeepSlice>_>,_std::less<Imf_3_2::Name>,_std::allocator<std::pair<const_Imf_3_2::Name,_Imf_3_2::DeepSlice>_>_>
      ::~_Rb_tree((_Rb_tree<Imf_3_2::Name,_std::pair<const_Imf_3_2::Name,_Imf_3_2::DeepSlice>,_std::_Select1st<std::pair<const_Imf_3_2::Name,_Imf_3_2::DeepSlice>_>,_std::less<Imf_3_2::Name>,_std::allocator<std::pair<const_Imf_3_2::Name,_Imf_3_2::DeepSlice>_>_>
                   *)&frameBuffer);
      Imf_3_2::DeepTiledOutputFile::~DeepTiledOutputFile(&file);
      return;
    }
    for (lVar38 = 0; iVar26 = Imf_3_2::DeepTiledOutputFile::numXLevels(), lVar38 < iVar26;
        lVar38 = lVar38 + 1) {
      Imf_3_2::DeepTiledOutputFile::dataWindowForLevel((int)&ss,(int)&file);
      iVar26 = (int)lVar38;
      if (bulkWrite) {
        for (j = 0; iVar8 = Imf_3_2::DeepTiledOutputFile::numYTiles((int)&file), j < iVar8;
            j = j + 1) {
          for (iVar8 = 0; iVar9 = Imf_3_2::DeepTiledOutputFile::numXTiles((int)&file), iVar8 < iVar9
              ; iVar8 = iVar8 + 1) {
            Imf_3_2::DeepTiledOutputFile::dataWindowForTile((int)&box,(int)&file,iVar8,j);
            iVar10 = box.max.x;
            iVar13 = box.max.y;
            iVar9 = box.min.y;
            if (box.min.y <= box.max.y) {
              do {
                iVar12 = box.min.x;
                if (box.min.x <= iVar10) {
                  do {
                    lVar36 = (long)_ss;
                    iVar10 = random_int(10);
                    lVar28 = (long)iVar9 - (long)iVar7;
                    lVar36 = iVar12 - lVar36;
                    *(int *)((long)pvVar17 + lVar36 * 4 + lVar28 * 0x444) = iVar10 + 1;
                    *(int *)(DAT_001f05f8[DAT_001f05f0 * local_2f0 * 3 + lVar38 * 3 + 1] * lVar28 *
                             4 + DAT_001f05f8[DAT_001f05f0 * local_2f0 * 3 + lVar38 * 3 + 2] +
                            lVar36 * 4) = iVar10 + 1;
                    if (0 < channelCount) {
                      iVar10 = ((int)lVar28 * 0x111 + (int)lVar36) % 0x801;
                      fVar40 = (float)iVar10;
                      uVar29 = (uint)fVar40 & 0x7fffff | 0x800000;
                      cVar4 = (char)((uint)fVar40 >> 0x17);
                      fVar11 = ABS(fVar40);
                      uVar22 = (ushort)((uint)fVar40 >> 0x10) & 0x8000;
                      uVar24 = (uint)fVar40 >> 0xd & 0x3ff;
                      uVar37 = uVar22 + 0x7c00;
                      if ((uint)fVar11 < 0x477ff000) {
                        uVar37 = (ushort)((int)fVar11 + 0x8000fff +
                                          (uint)(((uint)fVar11 >> 0xd & 1) != 0) >> 0xd) | uVar22;
                      }
                      uVar5 = (ushort)(uVar24 == 0) | (ushort)uVar24;
                      if (fVar11 == INFINITY) {
                        uVar5 = 0;
                      }
                      uVar5 = uVar22 + 0x7c00 + uVar5;
                      if ((uint)fVar11 < 0x7f800000) {
                        uVar5 = uVar37;
                      }
                      uVar37 = (ushort)(0x80000000 < uVar29 << (cVar4 + 0xa2U & 0x1f)) +
                               ((ushort)(uVar29 >> (0x7eU - cVar4 & 0x1f)) | uVar22);
                      if ((uint)fVar11 < 0x33000001) {
                        uVar37 = uVar22;
                      }
                      uVar18 = (ulong)*(uint *)((long)pvVar17 + lVar36 * 4 + lVar28 * 0x444);
                      if (0x387fffff < (uint)fVar11) {
                        uVar37 = uVar5;
                      }
                      uVar31 = 0;
                      piVar21 = (anonymous_namespace)::channelTypes;
                      do {
                        iVar13 = piVar21[uVar31];
                        if (iVar13 == 0) {
                          pvVar16 = operator_new__(uVar18 << 2);
                          data._data[uVar31]._data[data._data[uVar31]._sizeY * lVar28 + lVar36] =
                               pvVar16;
                          iVar13 = (anonymous_namespace)::channelTypes[uVar31];
                          piVar21 = (anonymous_namespace)::channelTypes;
                        }
                        if (iVar13 == 1) {
                          pvVar16 = operator_new__(uVar18 * 2);
                          data._data[uVar31]._data[data._data[uVar31]._sizeY * lVar28 + lVar36] =
                               pvVar16;
                          iVar13 = (anonymous_namespace)::channelTypes[uVar31];
                          piVar21 = (anonymous_namespace)::channelTypes;
                        }
                        if (iVar13 == 2) {
                          pvVar16 = operator_new__(uVar18 << 2);
                          data._data[uVar31]._data[data._data[uVar31]._sizeY * lVar28 + lVar36] =
                               pvVar16;
                          piVar21 = (anonymous_namespace)::channelTypes;
                        }
                        if ((int)uVar18 == 0) {
                          uVar18 = 0;
                        }
                        else {
                          iVar13 = piVar21[uVar31];
                          uVar34 = 0;
                          do {
                            if (iVar13 == 0) {
                              *(int *)((long)data._data[uVar31]._data
                                             [data._data[uVar31]._sizeY * lVar28 + lVar36] +
                                      uVar34 * 4) = iVar10;
                              iVar13 = piVar21[uVar31];
                            }
                            if (iVar13 == 2) {
                              *(float *)((long)data._data[uVar31]._data
                                               [data._data[uVar31]._sizeY * lVar28 + lVar36] +
                                        uVar34 * 4) = fVar40;
                            }
                            else if (iVar13 == 1) {
                              *(ushort *)
                               ((long)data._data[uVar31]._data
                                      [data._data[uVar31]._sizeY * lVar28 + lVar36] + uVar34 * 2) =
                                   uVar37;
                            }
                            uVar34 = uVar34 + 1;
                            uVar18 = (ulong)*(uint *)((long)pvVar17 + lVar36 * 4 + lVar28 * 0x444);
                          } while (uVar34 < uVar18);
                        }
                        uVar31 = uVar31 + 1;
                      } while (uVar31 != size);
                    }
                    bVar2 = iVar12 < box.max.x;
                    iVar10 = box.max.x;
                    iVar13 = box.max.y;
                    iVar12 = iVar12 + 1;
                  } while (bVar2);
                }
                bVar2 = iVar9 < iVar13;
                iVar9 = iVar9 + 1;
              } while (bVar2);
            }
          }
        }
        iVar8 = Imf_3_2::DeepTiledOutputFile::numXTiles((int)&file);
        iVar9 = Imf_3_2::DeepTiledOutputFile::numYTiles((int)&file);
        Imf_3_2::DeepTiledOutputFile::writeTiles((int)&file,0,iVar8 + -1,0,iVar9 + -1,iVar26);
      }
      else if (relativeCoords) {
        for (j = 0; iVar8 = Imf_3_2::DeepTiledOutputFile::numYTiles((int)&file), j < iVar8;
            j = j + 1) {
          for (iVar8 = 0; iVar9 = Imf_3_2::DeepTiledOutputFile::numXTiles((int)&file), iVar8 < iVar9
              ; iVar8 = iVar8 + 1) {
            Imf_3_2::DeepTiledOutputFile::dataWindowForTile((int)&box,(int)&file,iVar8,j);
            iVar10 = box.max.y;
            iVar13 = box.max.x;
            iVar9 = box.min.y;
            if (box.min.y <= box.max.y) {
              do {
                iVar12 = box.min.x;
                if (box.min.x <= iVar13) {
                  do {
                    lVar36 = (long)_ss;
                    lVar25 = (long)box.min.y;
                    lVar35 = (long)box.min.x;
                    iVar10 = random_int(10);
                    lVar28 = (long)iVar9 - (long)iVar7;
                    lVar36 = iVar12 - lVar36;
                    lVar35 = iVar12 - lVar35;
                    lVar25 = iVar9 - lVar25;
                    *(int *)((long)pvVar17 + lVar35 * 4 + lVar25 * 0x444) = iVar10 + 1;
                    *(int *)(DAT_001f05f8[DAT_001f05f0 * local_2f0 * 3 + lVar38 * 3 + 1] * lVar28 *
                             4 + DAT_001f05f8[DAT_001f05f0 * local_2f0 * 3 + lVar38 * 3 + 2] +
                            lVar36 * 4) = iVar10 + 1;
                    if (0 < channelCount) {
                      iVar10 = ((int)lVar28 * 0x111 + (int)lVar36) % 0x801;
                      fVar40 = (float)iVar10;
                      uVar29 = (uint)fVar40 & 0x7fffff | 0x800000;
                      cVar4 = (char)((uint)fVar40 >> 0x17);
                      fVar11 = ABS(fVar40);
                      uVar22 = (ushort)((uint)fVar40 >> 0x10) & 0x8000;
                      uVar24 = (uint)fVar40 >> 0xd & 0x3ff;
                      uVar37 = uVar22 + 0x7c00;
                      if ((uint)fVar11 < 0x477ff000) {
                        uVar37 = (ushort)((int)fVar11 + 0x8000fff +
                                          (uint)(((uint)fVar11 >> 0xd & 1) != 0) >> 0xd) | uVar22;
                      }
                      uVar5 = (ushort)(uVar24 == 0) | (ushort)uVar24;
                      if (fVar11 == INFINITY) {
                        uVar5 = 0;
                      }
                      uVar5 = uVar22 + 0x7c00 + uVar5;
                      if ((uint)fVar11 < 0x7f800000) {
                        uVar5 = uVar37;
                      }
                      uVar37 = (ushort)(0x80000000 < uVar29 << (cVar4 + 0xa2U & 0x1f)) +
                               ((ushort)(uVar29 >> (0x7eU - cVar4 & 0x1f)) | uVar22);
                      if ((uint)fVar11 < 0x33000001) {
                        uVar37 = uVar22;
                      }
                      uVar18 = (ulong)*(uint *)((long)pvVar17 + lVar35 * 4 + lVar25 * 0x444);
                      if (0x387fffff < (uint)fVar11) {
                        uVar37 = uVar5;
                      }
                      uVar31 = 0;
                      piVar21 = (anonymous_namespace)::channelTypes;
                      do {
                        iVar13 = piVar21[uVar31];
                        if (iVar13 == 0) {
                          pvVar16 = operator_new__(uVar18 << 2);
                          data._data[uVar31]._data[data._data[uVar31]._sizeY * lVar25 + lVar35] =
                               pvVar16;
                          iVar13 = (anonymous_namespace)::channelTypes[uVar31];
                          piVar21 = (anonymous_namespace)::channelTypes;
                        }
                        if (iVar13 == 1) {
                          pvVar16 = operator_new__(uVar18 * 2);
                          data._data[uVar31]._data[data._data[uVar31]._sizeY * lVar25 + lVar35] =
                               pvVar16;
                          iVar13 = (anonymous_namespace)::channelTypes[uVar31];
                          piVar21 = (anonymous_namespace)::channelTypes;
                        }
                        if (iVar13 == 2) {
                          pvVar16 = operator_new__(uVar18 << 2);
                          data._data[uVar31]._data[data._data[uVar31]._sizeY * lVar25 + lVar35] =
                               pvVar16;
                          piVar21 = (anonymous_namespace)::channelTypes;
                        }
                        if ((int)uVar18 == 0) {
                          uVar18 = 0;
                        }
                        else {
                          iVar13 = piVar21[uVar31];
                          uVar34 = 0;
                          do {
                            if (iVar13 == 0) {
                              *(int *)((long)data._data[uVar31]._data
                                             [data._data[uVar31]._sizeY * lVar25 + lVar35] +
                                      uVar34 * 4) = iVar10;
                              iVar13 = piVar21[uVar31];
                            }
                            if (iVar13 == 2) {
                              *(float *)((long)data._data[uVar31]._data
                                               [data._data[uVar31]._sizeY * lVar25 + lVar35] +
                                        uVar34 * 4) = fVar40;
                            }
                            else if (iVar13 == 1) {
                              *(ushort *)
                               ((long)data._data[uVar31]._data
                                      [data._data[uVar31]._sizeY * lVar25 + lVar35] + uVar34 * 2) =
                                   uVar37;
                            }
                            uVar34 = uVar34 + 1;
                            uVar18 = (ulong)*(uint *)((long)pvVar17 + lVar35 * 4 + lVar25 * 0x444);
                          } while (uVar34 < uVar18);
                        }
                        uVar31 = uVar31 + 1;
                      } while (uVar31 != size);
                    }
                    bVar2 = iVar12 < box.max.x;
                    iVar10 = box.max.y;
                    iVar13 = box.max.x;
                    iVar12 = iVar12 + 1;
                  } while (bVar2);
                }
                bVar2 = iVar9 < iVar10;
                iVar9 = iVar9 + 1;
              } while (bVar2);
            }
            Imf_3_2::DeepTiledOutputFile::writeTile((int)&file,iVar8,j,iVar26);
            iVar9 = box.min.y;
            iVar10 = box.max.y;
            iVar13 = box.max.x;
            if (box.min.y <= box.max.y) {
              do {
                iVar12 = box.min.x;
                if (box.min.x <= iVar13) {
                  do {
                    if (0 < channelCount) {
                      lVar28 = 4;
                      uVar18 = 0;
                      piVar21 = (anonymous_namespace)::channelTypes;
                      do {
                        lVar36 = (long)box.min.y;
                        lVar35 = (long)box.min.x;
                        iVar10 = piVar21[uVar18];
                        if (iVar10 == 0) {
                          pvVar16 = *(void **)(*(long *)((long)data._data + lVar28 * 4 + -8) *
                                               (iVar9 - lVar36) * 8 +
                                               *(long *)((long)&(data._data)->_sizeX + lVar28 * 4) +
                                              (iVar12 - lVar35) * 8);
                          if (pvVar16 != (void *)0x0) {
                            operator_delete__(pvVar16);
                            iVar10 = (anonymous_namespace)::channelTypes[uVar18];
                            piVar21 = (anonymous_namespace)::channelTypes;
                            goto LAB_0015659e;
                          }
                        }
                        else {
LAB_0015659e:
                          iVar13 = (int)(iVar9 - lVar36);
                          iVar33 = (int)(iVar12 - lVar35);
                          if (iVar10 == 1) {
                            pvVar16 = *(void **)((long)iVar13 *
                                                 *(long *)((long)data._data + lVar28 * 4 + -8) * 8 +
                                                 *(long *)((long)&(data._data)->_sizeX + lVar28 * 4)
                                                + (long)iVar33 * 8);
                            if (pvVar16 == (void *)0x0) goto LAB_00156608;
                            operator_delete__(pvVar16);
                            iVar10 = (anonymous_namespace)::channelTypes[uVar18];
                            piVar21 = (anonymous_namespace)::channelTypes;
                          }
                          if ((iVar10 == 2) &&
                             (pvVar16 = *(void **)((long)iVar13 *
                                                   *(long *)((long)data._data + lVar28 * 4 + -8) * 8
                                                   + *(long *)((long)&(data._data)->_sizeX +
                                                              lVar28 * 4) + (long)iVar33 * 8),
                             pvVar16 != (void *)0x0)) {
                            operator_delete__(pvVar16);
                            piVar21 = (anonymous_namespace)::channelTypes;
                          }
                        }
LAB_00156608:
                        uVar18 = uVar18 + 1;
                        lVar28 = lVar28 + 6;
                        iVar13 = box.max.x;
                      } while (size != uVar18);
                    }
                    bVar2 = iVar12 < iVar13;
                    iVar10 = box.max.y;
                    iVar12 = iVar12 + 1;
                  } while (bVar2);
                }
                bVar2 = iVar9 < iVar10;
                iVar9 = iVar9 + 1;
              } while (bVar2);
            }
          }
        }
      }
      else {
        for (iVar8 = 0; iVar9 = Imf_3_2::DeepTiledOutputFile::numYTiles((int)&file), iVar8 < iVar9;
            iVar8 = iVar8 + 1) {
          for (iVar9 = 0; iVar10 = Imf_3_2::DeepTiledOutputFile::numXTiles((int)&file),
              iVar9 < iVar10; iVar9 = iVar9 + 1) {
            Imf_3_2::DeepTiledOutputFile::dataWindowForTile((int)&box,(int)&file,iVar9,iVar8);
            iVar13 = box.max.y;
            iVar12 = box.max.x;
            iVar10 = box.min.y;
            if (box.min.y <= box.max.y) {
              do {
                iVar33 = box.min.x;
                if (box.min.x <= iVar12) {
                  do {
                    lVar36 = (long)_ss;
                    iVar13 = random_int(10);
                    lVar28 = (long)iVar10 - (long)iVar7;
                    lVar36 = iVar33 - lVar36;
                    *(int *)((long)pvVar17 + lVar36 * 4 + lVar28 * 0x444) = iVar13 + 1;
                    *(int *)(DAT_001f05f8[DAT_001f05f0 * local_2f0 * 3 + lVar38 * 3 + 1] * lVar28 *
                             4 + DAT_001f05f8[DAT_001f05f0 * local_2f0 * 3 + lVar38 * 3 + 2] +
                            lVar36 * 4) = iVar13 + 1;
                    if (0 < channelCount) {
                      iVar13 = ((int)lVar28 * 0x111 + (int)lVar36) % 0x801;
                      fVar40 = (float)iVar13;
                      uVar29 = (uint)fVar40 & 0x7fffff | 0x800000;
                      cVar4 = (char)((uint)fVar40 >> 0x17);
                      fVar11 = ABS(fVar40);
                      uVar22 = (ushort)((uint)fVar40 >> 0x10) & 0x8000;
                      uVar24 = (uint)fVar40 >> 0xd & 0x3ff;
                      uVar37 = uVar22 + 0x7c00;
                      if ((uint)fVar11 < 0x477ff000) {
                        uVar37 = (ushort)((int)fVar11 + 0x8000fff +
                                          (uint)(((uint)fVar11 >> 0xd & 1) != 0) >> 0xd) | uVar22;
                      }
                      uVar5 = (ushort)(uVar24 == 0) | (ushort)uVar24;
                      if (fVar11 == INFINITY) {
                        uVar5 = 0;
                      }
                      uVar5 = uVar22 + 0x7c00 + uVar5;
                      if ((uint)fVar11 < 0x7f800000) {
                        uVar5 = uVar37;
                      }
                      uVar37 = (ushort)(0x80000000 < uVar29 << (cVar4 + 0xa2U & 0x1f)) +
                               ((ushort)(uVar29 >> (0x7eU - cVar4 & 0x1f)) | uVar22);
                      if ((uint)fVar11 < 0x33000001) {
                        uVar37 = uVar22;
                      }
                      uVar18 = (ulong)*(uint *)((long)pvVar17 + lVar36 * 4 + lVar28 * 0x444);
                      if (0x387fffff < (uint)fVar11) {
                        uVar37 = uVar5;
                      }
                      uVar31 = 0;
                      piVar21 = (anonymous_namespace)::channelTypes;
                      do {
                        iVar12 = piVar21[uVar31];
                        if (iVar12 == 0) {
                          pvVar16 = operator_new__(uVar18 << 2);
                          data._data[uVar31]._data[data._data[uVar31]._sizeY * lVar28 + lVar36] =
                               pvVar16;
                          iVar12 = (anonymous_namespace)::channelTypes[uVar31];
                          piVar21 = (anonymous_namespace)::channelTypes;
                        }
                        if (iVar12 == 1) {
                          pvVar16 = operator_new__(uVar18 * 2);
                          data._data[uVar31]._data[data._data[uVar31]._sizeY * lVar28 + lVar36] =
                               pvVar16;
                          iVar12 = (anonymous_namespace)::channelTypes[uVar31];
                          piVar21 = (anonymous_namespace)::channelTypes;
                        }
                        if (iVar12 == 2) {
                          pvVar16 = operator_new__(uVar18 << 2);
                          data._data[uVar31]._data[data._data[uVar31]._sizeY * lVar28 + lVar36] =
                               pvVar16;
                          piVar21 = (anonymous_namespace)::channelTypes;
                        }
                        if ((int)uVar18 == 0) {
                          uVar18 = 0;
                        }
                        else {
                          iVar12 = piVar21[uVar31];
                          uVar34 = 0;
                          do {
                            if (iVar12 == 0) {
                              *(int *)((long)data._data[uVar31]._data
                                             [data._data[uVar31]._sizeY * lVar28 + lVar36] +
                                      uVar34 * 4) = iVar13;
                              iVar12 = piVar21[uVar31];
                            }
                            if (iVar12 == 2) {
                              *(float *)((long)data._data[uVar31]._data
                                               [data._data[uVar31]._sizeY * lVar28 + lVar36] +
                                        uVar34 * 4) = fVar40;
                            }
                            else if (iVar12 == 1) {
                              *(ushort *)
                               ((long)data._data[uVar31]._data
                                      [data._data[uVar31]._sizeY * lVar28 + lVar36] + uVar34 * 2) =
                                   uVar37;
                            }
                            uVar34 = uVar34 + 1;
                            uVar18 = (ulong)*(uint *)((long)pvVar17 + lVar36 * 4 + lVar28 * 0x444);
                          } while (uVar34 < uVar18);
                        }
                        uVar31 = uVar31 + 1;
                      } while (uVar31 != size);
                    }
                    bVar2 = iVar33 < box.max.x;
                    iVar13 = box.max.y;
                    iVar12 = box.max.x;
                    iVar33 = iVar33 + 1;
                  } while (bVar2);
                }
                bVar2 = iVar10 < iVar13;
                iVar10 = iVar10 + 1;
              } while (bVar2);
            }
            Imf_3_2::DeepTiledOutputFile::writeTile((int)&file,iVar9,iVar8,iVar26);
          }
        }
      }
      if (!relativeCoords) {
        for (lVar28 = 0; iVar26 = Imf_3_2::DeepTiledOutputFile::levelHeight((int)&file),
            lVar28 < iVar26; lVar28 = lVar28 + 1) {
          for (lVar36 = 0; iVar26 = Imf_3_2::DeepTiledOutputFile::levelWidth((int)&file),
              lVar36 < iVar26; lVar36 = lVar36 + 1) {
            if (0 < channelCount) {
              lVar35 = 4;
              uVar18 = 0;
              piVar21 = (anonymous_namespace)::channelTypes;
              do {
                iVar26 = piVar21[uVar18];
                if (iVar26 == 0) {
                  pvVar16 = *(void **)(*(long *)((long)data._data + lVar35 * 4 + -8) * lVar28 * 8 +
                                       *(long *)((long)&(data._data)->_sizeX + lVar35 * 4) +
                                      lVar36 * 8);
                  if (pvVar16 != (void *)0x0) {
                    operator_delete__(pvVar16);
                    iVar26 = (anonymous_namespace)::channelTypes[uVar18];
                    piVar21 = (anonymous_namespace)::channelTypes;
                    goto LAB_00156b2e;
                  }
                }
                else {
LAB_00156b2e:
                  if (iVar26 == 1) {
                    pvVar16 = *(void **)(*(long *)((long)data._data + lVar35 * 4 + -8) * lVar28 * 8
                                         + *(long *)((long)&(data._data)->_sizeX + lVar35 * 4) +
                                        lVar36 * 8);
                    if (pvVar16 == (void *)0x0) goto LAB_00156b92;
                    operator_delete__(pvVar16);
                    iVar26 = (anonymous_namespace)::channelTypes[uVar18];
                    piVar21 = (anonymous_namespace)::channelTypes;
                  }
                  if ((iVar26 == 2) &&
                     (pvVar16 = *(void **)(*(long *)((long)data._data + lVar35 * 4 + -8) * lVar28 *
                                           8 + *(long *)((long)&(data._data)->_sizeX + lVar35 * 4) +
                                          lVar36 * 8), pvVar16 != (void *)0x0)) {
                    operator_delete__(pvVar16);
                    piVar21 = (anonymous_namespace)::channelTypes;
                  }
                }
LAB_00156b92:
                uVar18 = uVar18 + 1;
                lVar35 = lVar35 + 6;
              } while (size != uVar18);
            }
          }
        }
      }
    }
    local_2f0 = local_2f0 + 1;
  } while( true );
}

Assistant:

void
generateRandomFile (
    int                channelCount,
    Compression        compression,
    bool               bulkWrite,
    bool               relativeCoords,
    const std::string& filename)
{
    if (relativeCoords) assert (bulkWrite == false);

    cout << "generating " << flush;
    header = Header (
        displayWindow,
        dataWindow,
        1,
        IMATH_NAMESPACE::V2f (0, 0),
        1,
        INCREASING_Y,
        compression);
    cout << "compression " << compression << " " << flush;

    //
    // Add channels.
    //

    channelTypes.clear ();

    for (int i = 0; i < channelCount; i++)
    {
        int          type = random_int (3);
        stringstream ss;
        ss << i;
        string str = ss.str ();
        if (type == 0) header.channels ().insert (str, Channel (IMF::UINT));
        if (type == 1) header.channels ().insert (str, Channel (IMF::HALF));
        if (type == 2) header.channels ().insert (str, Channel (IMF::FLOAT));
        channelTypes.push_back (type);
    }

    header.setType (DEEPTILE);
    header.setTileDescription (TileDescription (
        random_int (width) + 1, random_int (height) + 1, RIPMAP_LEVELS));

    //
    // Set up the output file
    //
    remove (filename.c_str ());
    DeepTiledOutputFile file (filename.c_str (), header, 8);

    DeepFrameBuffer frameBuffer;

    Array<Array2D<void*>> data (channelCount);
    for (int i = 0; i < channelCount; i++)
        data[i].resizeErase (height, width);

    Array2D<unsigned int> sampleCount;
    sampleCount.resizeErase (height, width);

    cout << " tileSizeX " << file.tileXSize () << " tileSizeY "
         << file.tileYSize () << " ";

    sampleCountWhole.resizeErase (file.numYLevels (), file.numXLevels ());
    for (int i = 0; i < sampleCountWhole.height (); i++)
        for (int j = 0; j < sampleCountWhole.width (); j++)
            sampleCountWhole[i][j].resizeErase (height, width);

    int memOffset;
    if (relativeCoords)
        memOffset = 0;
    else
        memOffset = dataWindow.min.x + dataWindow.min.y * width;

    frameBuffer.insertSampleCountSlice (Slice (
        IMF::UINT,
        (char*) (&sampleCount[0][0] - memOffset),
        sizeof (unsigned int) * 1,
        sizeof (unsigned int) * width,
        1,
        1,
        0,
        relativeCoords,
        relativeCoords));

    for (int i = 0; i < channelCount; i++)
    {
        PixelType type = NUM_PIXELTYPES;
        if (channelTypes[i] == 0) type = IMF::UINT;
        if (channelTypes[i] == 1) type = IMF::HALF;
        if (channelTypes[i] == 2) type = IMF::FLOAT;

        stringstream ss;
        ss << i;
        string str = ss.str ();

        int sampleSize = 0;
        if (channelTypes[i] == 0) sampleSize = sizeof (unsigned int);
        if (channelTypes[i] == 1) sampleSize = sizeof (half);
        if (channelTypes[i] == 2) sampleSize = sizeof (float);

        int pointerSize = sizeof (char*);

        frameBuffer.insert (
            str,
            DeepSlice (
                type,
                (char*) (&data[i][0][0] - memOffset),
                pointerSize * 1,
                pointerSize * width,
                sampleSize,
                1,
                1,
                0,
                relativeCoords,
                relativeCoords));
    }

    file.setFrameBuffer (frameBuffer);

    cout << "writing " << flush;

    if (bulkWrite)
        cout << "bulk " << flush;
    else
    {
        if (relativeCoords == false)
            cout << "per-tile " << flush;
        else
            cout << "per-tile with relative coordinates " << flush;
    }

    for (int ly = 0; ly < file.numYLevels (); ly++)
        for (int lx = 0; lx < file.numXLevels (); lx++)
        {
            Box2i dataWindowL = file.dataWindowForLevel (lx, ly);

            if (bulkWrite)
            {
                //
                // Bulk write (without relative coordinates).
                //

                for (int j = 0; j < file.numYTiles (ly); j++)
                {
                    for (int i = 0; i < file.numXTiles (lx); i++)
                    {
                        Box2i box = file.dataWindowForTile (i, j, lx, ly);
                        for (int y = box.min.y; y <= box.max.y; y++)
                            for (int x = box.min.x; x <= box.max.x; x++)
                            {
                                int dwy               = y - dataWindowL.min.y;
                                int dwx               = x - dataWindowL.min.x;
                                sampleCount[dwy][dwx] = random_int (10) + 1;
                                sampleCountWhole[ly][lx][dwy][dwx] =
                                    sampleCount[dwy][dwx];
                                for (int k = 0; k < channelCount; k++)
                                {
                                    if (channelTypes[k] == 0)
                                        data[k][dwy][dwx] =
                                            new unsigned int[sampleCount[dwy]
                                                                        [dwx]];
                                    if (channelTypes[k] == 1)
                                        data[k][dwy][dwx] =
                                            new half[sampleCount[dwy][dwx]];
                                    if (channelTypes[k] == 2)
                                        data[k][dwy][dwx] =
                                            new float[sampleCount[dwy][dwx]];
                                    for (unsigned int l = 0;
                                         l < sampleCount[dwy][dwx];
                                         l++)
                                    {
                                        if (channelTypes[k] == 0)
                                            ((unsigned int*)
                                                 data[k][dwy][dwx])[l] =
                                                (dwy * width + dwx) % 2049;
                                        if (channelTypes[k] == 1)
                                            ((half*) data[k][dwy][dwx])[l] =
                                                (dwy * width + dwx) % 2049;
                                        if (channelTypes[k] == 2)
                                            ((float*) data[k][dwy][dwx])[l] =
                                                (dwy * width + dwx) % 2049;
                                    }
                                }
                            }
                    }
                }

                file.writeTiles (
                    0,
                    file.numXTiles (lx) - 1,
                    0,
                    file.numYTiles (ly) - 1,
                    lx,
                    ly);
            }
            else if (bulkWrite == false)
            {
                if (relativeCoords == false)
                {
                    //
                    // Per-tile write without relative coordinates.
                    //

                    for (int j = 0; j < file.numYTiles (ly); j++)
                    {
                        for (int i = 0; i < file.numXTiles (lx); i++)
                        {
                            Box2i box = file.dataWindowForTile (i, j, lx, ly);
                            for (int y = box.min.y; y <= box.max.y; y++)
                                for (int x = box.min.x; x <= box.max.x; x++)
                                {
                                    int dwy = y - dataWindowL.min.y;
                                    int dwx = x - dataWindowL.min.x;
                                    sampleCount[dwy][dwx] = random_int (10) + 1;
                                    sampleCountWhole[ly][lx][dwy][dwx] =
                                        sampleCount[dwy][dwx];
                                    for (int k = 0; k < channelCount; k++)
                                    {
                                        if (channelTypes[k] == 0)
                                            data[k][dwy][dwx] = new unsigned int
                                                [sampleCount[dwy][dwx]];
                                        if (channelTypes[k] == 1)
                                            data[k][dwy][dwx] =
                                                new half[sampleCount[dwy][dwx]];
                                        if (channelTypes[k] == 2)
                                            data[k][dwy][dwx] =
                                                new float[sampleCount[dwy]
                                                                     [dwx]];
                                        for (unsigned int l = 0;
                                             l < sampleCount[dwy][dwx];
                                             l++)
                                        {
                                            if (channelTypes[k] == 0)
                                                ((unsigned int*)
                                                     data[k][dwy][dwx])[l] =
                                                    (dwy * width + dwx) % 2049;
                                            if (channelTypes[k] == 1)
                                                ((half*) data[k][dwy][dwx])[l] =
                                                    (dwy * width + dwx) % 2049;
                                            if (channelTypes[k] == 2)
                                                ((float*)
                                                     data[k][dwy][dwx])[l] =
                                                    (dwy * width + dwx) % 2049;
                                        }
                                    }
                                }
                            file.writeTile (i, j, lx, ly);
                        }
                    }
                }
                else if (relativeCoords)
                {
                    //
                    // Per-tile write with relative coordinates.
                    //

                    for (int j = 0; j < file.numYTiles (ly); j++)
                    {
                        for (int i = 0; i < file.numXTiles (lx); i++)
                        {
                            Box2i box = file.dataWindowForTile (i, j, lx, ly);
                            for (int y = box.min.y; y <= box.max.y; y++)
                                for (int x = box.min.x; x <= box.max.x; x++)
                                {
                                    int dwy             = y - dataWindowL.min.y;
                                    int dwx             = x - dataWindowL.min.x;
                                    int ty              = y - box.min.y;
                                    int tx              = x - box.min.x;
                                    sampleCount[ty][tx] = random_int (10) + 1;
                                    sampleCountWhole[ly][lx][dwy][dwx] =
                                        sampleCount[ty][tx];
                                    for (int k = 0; k < channelCount; k++)
                                    {
                                        if (channelTypes[k] == 0)
                                            data[k][ty][tx] = new unsigned int
                                                [sampleCount[ty][tx]];
                                        if (channelTypes[k] == 1)
                                            data[k][ty][tx] =
                                                new half[sampleCount[ty][tx]];
                                        if (channelTypes[k] == 2)
                                            data[k][ty][tx] =
                                                new float[sampleCount[ty][tx]];
                                        for (unsigned int l = 0;
                                             l < sampleCount[ty][tx];
                                             l++)
                                        {
                                            if (channelTypes[k] == 0)
                                                ((unsigned int*)
                                                     data[k][ty][tx])[l] =
                                                    (dwy * width + dwx) % 2049;
                                            if (channelTypes[k] == 1)
                                                ((half*) data[k][ty][tx])[l] =
                                                    (dwy * width + dwx) % 2049;
                                            if (channelTypes[k] == 2)
                                                ((float*) data[k][ty][tx])[l] =
                                                    (dwy * width + dwx) % 2049;
                                        }
                                    }
                                }
                            file.writeTile (i, j, lx, ly);

                            for (int y = box.min.y; y <= box.max.y; y++)
                                for (int x = box.min.x; x <= box.max.x; x++)
                                    for (int k = 0; k < channelCount; k++)
                                    {
                                        int ty = y - box.min.y;
                                        int tx = x - box.min.x;
                                        if (channelTypes[k] == 0)
                                            delete[](unsigned int*)
                                                data[k][ty][tx];
                                        if (channelTypes[k] == 1)
                                            delete[](half*) data[k][ty][tx];
                                        if (channelTypes[k] == 2)
                                            delete[](float*) data[k][ty][tx];
                                    }
                        }
                    }
                }
            }

            if (relativeCoords == false)
            {
                for (int i = 0; i < file.levelHeight (ly); i++)
                    for (int j = 0; j < file.levelWidth (lx); j++)
                        for (int k = 0; k < channelCount; k++)
                        {
                            if (channelTypes[k] == 0)
                                delete[](unsigned int*) data[k][i][j];
                            if (channelTypes[k] == 1)
                                delete[](half*) data[k][i][j];
                            if (channelTypes[k] == 2)
                                delete[](float*) data[k][i][j];
                        }
            }
        }
}